

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O0

bool file_exists(char *path)

{
  FILE *__stream;
  FILE *file;
  char *path_local;
  
  __stream = fopen(path,"rb");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

static bool file_exists(const char *path)
{
	FILE *file = fopen(path, "rb");
	if (file)
	{
		fclose(file);
		return true;
	}
	else
		return false;
}